

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-graph.hxx
# Opt level: O3

bool __thiscall
lineage::ProblemGraph::
SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::edge
          (SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *this,size_t i)

{
  size_t sVar1;
  pointer pEVar2;
  size_t sVar3;
  
  if ((this->edgeLabels_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
      .super__Vector_impl_data._M_start[i] == '\0') {
    sVar1 = this->firstFrame_;
    pEVar2 = (this->problem_->edges).
             super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = (size_t)pEVar2[i].t0;
    if (sVar1 == sVar3 || sVar1 + 1 == sVar3) {
      sVar3 = (size_t)pEVar2[i].t1;
      return sVar1 + 1 == sVar3 || sVar1 == sVar3;
    }
  }
  return false;
}

Assistant:

bool edge(size_t i) const
        {
            if (edgeLabels_[i] != 0)
                return false;

            auto t = problem_.edges[i].t0;
            if (t != firstFrame_ && t != firstFrame_ + 1)
                return false;

            t = problem_.edges[i].t1;
            if (t != firstFrame_ && t != firstFrame_ + 1)
                return false;

            return true;
        }